

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlEntityPtr xmlGetParameterEntity(xmlDocPtr doc,xmlChar *name)

{
  xmlHashTablePtr pxVar1;
  xmlEntityPtr pxVar2;
  
  if (doc != (xmlDocPtr)0x0) {
    if (((doc->intSubset != (_xmlDtd *)0x0) &&
        (pxVar1 = (xmlHashTablePtr)doc->intSubset->pentities, pxVar1 != (xmlHashTablePtr)0x0)) &&
       (pxVar2 = (xmlEntityPtr)xmlHashLookup(pxVar1,name), pxVar2 != (xmlEntityPtr)0x0)) {
      return pxVar2;
    }
    if ((doc->extSubset != (_xmlDtd *)0x0) &&
       (pxVar1 = (xmlHashTablePtr)doc->extSubset->pentities, pxVar1 != (xmlHashTablePtr)0x0)) {
      pxVar2 = (xmlEntityPtr)xmlHashLookup(pxVar1,name);
      return pxVar2;
    }
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlGetParameterEntity(xmlDocPtr doc, const xmlChar *name) {
    xmlEntitiesTablePtr table;
    xmlEntityPtr ret;

    if (doc == NULL)
	return(NULL);
    if ((doc->intSubset != NULL) && (doc->intSubset->pentities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->intSubset->pentities;
	ret = xmlGetEntityFromTable(table, name);
	if (ret != NULL)
	    return(ret);
    }
    if ((doc->extSubset != NULL) && (doc->extSubset->pentities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->extSubset->pentities;
	return(xmlGetEntityFromTable(table, name));
    }
    return(NULL);
}